

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O0

istream * FIX::operator>>(istream *stream,SessionSettings *s)

{
  undefined8 this;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  string *beginString_00;
  string *senderCompID_00;
  string *targetCompID_00;
  Dictionary local_5b0;
  undefined1 local_558 [8];
  SessionID sessionID;
  string local_400;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  undefined1 local_398 [8];
  string sessionQualifier;
  string local_370;
  string local_350;
  undefined1 local_330 [8];
  TargetCompID targetCompID;
  string local_2d0;
  string local_2b0;
  undefined1 local_290 [8];
  SenderCompID senderCompID;
  string local_230;
  string local_210;
  undefined1 local_1f0 [8];
  BeginString beginString;
  Dictionary dict;
  size_type session;
  string local_130;
  Sections local_110;
  undefined1 local_f8 [8];
  Dictionary def;
  string local_98;
  Sections local_78;
  undefined1 local_60 [8];
  Sections section;
  undefined1 local_38 [8];
  Settings settings;
  SessionSettings *s_local;
  istream *stream_local;
  
  settings._24_8_ = s;
  Settings::Settings((Settings *)local_38,(bool)(s->m_resolveEnvVars & 1));
  operator>>(stream,(Settings *)local_38);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"DEFAULT",
             (allocator<char> *)(def.m_name.field_2._M_local_buf + 0xf));
  Settings::get(&local_78,(Settings *)local_38,&local_98);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::operator=
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_60,&local_78);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)(def.m_name.field_2._M_local_buf + 0xf));
  Dictionary::Dictionary((Dictionary *)local_f8);
  sVar2 = std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::size
                    ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_60);
  if (sVar2 != 0) {
    pvVar3 = std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::operator[]
                       ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_60,0);
    Dictionary::operator=((Dictionary *)local_f8,pvVar3);
  }
  SessionSettings::set((SessionSettings *)settings._24_8_,(Dictionary *)local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"SESSION",(allocator<char> *)((long)&session + 7));
  Settings::get(&local_110,(Settings *)local_38,&local_130);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::operator=
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_60,&local_110);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&session + 7));
  Dictionary::Dictionary((Dictionary *)&beginString.super_StringField.super_FieldBase.m_metrics);
  for (dict.m_name.field_2._8_8_ = 0;
      sVar2 = std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::size
                        ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_60),
      (ulong)dict.m_name.field_2._8_8_ < sVar2;
      dict.m_name.field_2._8_8_ = dict.m_name.field_2._8_8_ + 1) {
    pvVar3 = std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::operator[]
                       ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_60,
                        dict.m_name.field_2._8_8_);
    Dictionary::operator=
              ((Dictionary *)&beginString.super_StringField.super_FieldBase.m_metrics,pvVar3);
    Dictionary::merge((Dictionary *)&beginString.super_StringField.super_FieldBase.m_metrics,
                      (Dictionary *)local_f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"BeginString",
               (allocator<char> *)
               ((long)&senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum + 3));
    Dictionary::getString
              (&local_210,(Dictionary *)&beginString.super_StringField.super_FieldBase.m_metrics,
               &local_230,false);
    BeginString::BeginString((BeginString *)local_1f0,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum + 3));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"SenderCompID",
               (allocator<char> *)
               ((long)&targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum + 3));
    Dictionary::getString
              (&local_2b0,(Dictionary *)&beginString.super_StringField.super_FieldBase.m_metrics,
               &local_2d0,false);
    SenderCompID::SenderCompID((SenderCompID *)local_290,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum + 3));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"TargetCompID",
               (allocator<char> *)(sessionQualifier.field_2._M_local_buf + 0xf));
    Dictionary::getString
              (&local_350,(Dictionary *)&beginString.super_StringField.super_FieldBase.m_metrics,
               &local_370,false);
    TargetCompID::TargetCompID((TargetCompID *)local_330,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator
              ((allocator<char> *)(sessionQualifier.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)local_398);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"SessionQualifier",&local_3b9);
    bVar1 = Dictionary::has((Dictionary *)&beginString.super_StringField.super_FieldBase.m_metrics,
                            &local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_400,"SessionQualifier",
                 (allocator<char> *)(sessionID.m_frozenString.field_2._M_local_buf + 0xf));
      Dictionary::getString
                (&local_3e0,(Dictionary *)&beginString.super_StringField.super_FieldBase.m_metrics,
                 &local_400,false);
      std::__cxx11::string::operator=((string *)local_398,(string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_400);
      std::allocator<char>::~allocator
                ((allocator<char> *)(sessionID.m_frozenString.field_2._M_local_buf + 0xf));
    }
    beginString_00 = StringField::operator_cast_to_string_((StringField *)local_1f0);
    senderCompID_00 = StringField::operator_cast_to_string_((StringField *)local_290);
    targetCompID_00 = StringField::operator_cast_to_string_((StringField *)local_330);
    SessionID::SessionID
              ((SessionID *)local_558,beginString_00,senderCompID_00,targetCompID_00,
               (string *)local_398);
    this = settings._24_8_;
    Dictionary::Dictionary
              (&local_5b0,(Dictionary *)&beginString.super_StringField.super_FieldBase.m_metrics);
    SessionSettings::set((SessionSettings *)this,(SessionID *)local_558,&local_5b0);
    Dictionary::~Dictionary(&local_5b0);
    SessionID::~SessionID((SessionID *)local_558);
    std::__cxx11::string::~string((string *)local_398);
    TargetCompID::~TargetCompID((TargetCompID *)local_330);
    SenderCompID::~SenderCompID((SenderCompID *)local_290);
    BeginString::~BeginString((BeginString *)local_1f0);
  }
  Dictionary::~Dictionary((Dictionary *)&beginString.super_StringField.super_FieldBase.m_metrics);
  Dictionary::~Dictionary((Dictionary *)local_f8);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_60);
  Settings::~Settings((Settings *)local_38);
  return stream;
}

Assistant:

EXCEPT(ConfigError) {
  Settings settings(s.m_resolveEnvVars);
  stream >> settings;

  Settings::Sections section;

  section = settings.get("DEFAULT");
  Dictionary def;
  if (section.size()) {
    def = section[0];
  }
  s.set(def);

  section = settings.get("SESSION");
  Settings::Sections::size_type session;
  Dictionary dict;

  for (session = 0; session < section.size(); ++session) {
    dict = section[session];
    dict.merge(def);

    BeginString beginString(dict.getString(BEGINSTRING));
    SenderCompID senderCompID(dict.getString(SENDERCOMPID));
    TargetCompID targetCompID(dict.getString(TARGETCOMPID));

    std::string sessionQualifier;
    if (dict.has(SESSION_QUALIFIER)) {
      sessionQualifier = dict.getString(SESSION_QUALIFIER);
    }
    SessionID sessionID(beginString, senderCompID, targetCompID, sessionQualifier);
    s.set(sessionID, dict);
  }
  return stream;
}